

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_do_drawmove(void *x,t_iemgui *iemgui)

{
  int iVar1;
  int iVar2;
  int ypos;
  int xpos;
  t_iemgui *iemgui_local;
  void *x_local;
  
  iVar1 = glist_isvisible(iemgui->x_glist);
  if (iVar1 != 0) {
    iVar1 = text_xpix(&iemgui->x_obj,iemgui->x_glist);
    iVar2 = text_ypix(&iemgui->x_obj,iemgui->x_glist);
    (*iemgui->x_draw)(x,iemgui->x_glist,1);
    iemgui->x_private->p_prevX = iVar1;
    iemgui->x_private->p_prevY = iVar2;
    canvas_fixlinesfor(iemgui->x_glist,(t_text *)x);
  }
  return;
}

Assistant:

static void iemgui_do_drawmove(void *x, t_iemgui*iemgui)
{
    if(glist_isvisible(iemgui->x_glist))
    {
        int xpos = text_xpix(&iemgui->x_obj, iemgui->x_glist);
        int ypos = text_ypix(&iemgui->x_obj, iemgui->x_glist);
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_MOVE);
        iemgui->x_private->p_prevX = xpos;
        iemgui->x_private->p_prevY = ypos;
        canvas_fixlinesfor(iemgui->x_glist, (t_text*)x);
    }
}